

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  KernelCase KVar1;
  LogMessage *other;
  LinearKernel *this_00;
  LinearKernel *from_00;
  RBFKernel *this_01;
  RBFKernel *from_01;
  PolyKernel *this_02;
  PolyKernel *from_02;
  SigmoidKernel *this_03;
  SigmoidKernel *from_03;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  Kernel *local_18;
  Kernel *from_local;
  Kernel *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/SVM.pb.cc"
               ,0x55b);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  KVar1 = kernel_case(local_18);
  switch(KVar1) {
  case KERNEL_NOT_SET:
    break;
  case kLinearKernel:
    this_00 = _internal_mutable_linearkernel(this);
    from_00 = _internal_linearkernel(local_18);
    LinearKernel::MergeFrom(this_00,from_00);
    break;
  case kRbfKernel:
    this_01 = _internal_mutable_rbfkernel(this);
    from_01 = _internal_rbfkernel(local_18);
    RBFKernel::MergeFrom(this_01,from_01);
    break;
  case kPolyKernel:
    this_02 = _internal_mutable_polykernel(this);
    from_02 = _internal_polykernel(local_18);
    PolyKernel::MergeFrom(this_02,from_02);
    break;
  case kSigmoidKernel:
    this_03 = _internal_mutable_sigmoidkernel(this);
    from_03 = _internal_sigmoidkernel(local_18);
    SigmoidKernel::MergeFrom(this_03,from_03);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      _internal_mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from._internal_linearkernel());
      break;
    }
    case kRbfKernel: {
      _internal_mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from._internal_rbfkernel());
      break;
    }
    case kPolyKernel: {
      _internal_mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from._internal_polykernel());
      break;
    }
    case kSigmoidKernel: {
      _internal_mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from._internal_sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}